

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeof.h
# Opt level: O0

void __thiscall dap::BasicTypeInfo<dap::number>::~BasicTypeInfo(BasicTypeInfo<dap::number> *this)

{
  BasicTypeInfo<dap::number> *this_local;
  
  ~BasicTypeInfo(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

constexpr BasicTypeInfo(std::string&& name) : name_(std::move(name)) {}